

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v2.cc
# Opt level: O3

RefEl lf::io::RefElOf(ElementType et)

{
  uint uVar1;
  runtime_error *this;
  stringstream ss;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  uVar1 = et - EDGE2;
  if ((uVar1 < 0x1c) && ((0xff8c387U >> (uVar1 & 0x1f) & 1) != 0)) {
    return (RefEl)(&DAT_002b47b7)[uVar1];
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"Reference element not supported for GmshElement type ",0x35);
  operator<<(local_190,et);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"false","");
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_file_v2.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  lf::base::AssertionFailed(&local_1e0,&local_200,0x134,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"this code should not be reached");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

base::RefEl RefElOf(GMshFileV2::ElementType et) {
  switch (et) {
    case GMshFileV2::ElementType::POINT:
      return base::RefEl::kPoint();

    case GMshFileV2::ElementType::EDGE2:
    case GMshFileV2::ElementType::EDGE3:
    case GMshFileV2::ElementType::EDGE4:
    case GMshFileV2::ElementType::EDGE5:
    case GMshFileV2::ElementType::EDGE6:
      return base::RefEl::kSegment();

    case GMshFileV2::ElementType::TRIA3:
    case GMshFileV2::ElementType::TRIA6:
    case GMshFileV2::ElementType::TRIA9:
    case GMshFileV2::ElementType::TRIA10:
    case GMshFileV2::ElementType::TRIA12:
    case GMshFileV2::ElementType::TRIA15:
    case GMshFileV2::ElementType::TRIA15_5:
    case GMshFileV2::ElementType::TRIA21:
      return base::RefEl::kTria();

    case GMshFileV2::ElementType::QUAD4:
    case GMshFileV2::ElementType::QUAD8:
    case GMshFileV2::ElementType::QUAD9:
      return base::RefEl::kQuad();

    case GMshFileV2::ElementType::TET4:
    case GMshFileV2::ElementType::HEX8:
    case GMshFileV2::ElementType::PRISM6:
    case GMshFileV2::ElementType::PYRAMID5:
    case GMshFileV2::ElementType::TET10:
    case GMshFileV2::ElementType::HEX27:
    case GMshFileV2::ElementType::PRISM18:
    case GMshFileV2::ElementType::PYRAMID14:
    case GMshFileV2::ElementType::HEX20:
    case GMshFileV2::ElementType::PRISM15:
    case GMshFileV2::ElementType::PYRAMID13:
    case GMshFileV2::ElementType::TET20:
    case GMshFileV2::ElementType::TET35:
    case GMshFileV2::ElementType::TET56:
    case GMshFileV2::ElementType::HEX64:
    case GMshFileV2::ElementType::HEX125:
    default:
      LF_VERIFY_MSG(
          false, "Reference element not supported for GmshElement type " << et);
  }
}